

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

void anon_unknown.dwarf_2117df::debug_service_register(Caliper *c,Channel *chn)

{
  Events *pEVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  sockaddr *__addr_06;
  sockaddr *__addr_07;
  string local_3b8;
  Log local_398;
  _func_void_Caliper_ptr_SnapshotView_SnapshotView *local_190;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)> local_188;
  _func_void_Caliper_ptr_SnapshotView_SnapshotBuilder_ptr *local_168;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)> local_160;
  _func_void_Caliper_ptr_Channel_ptr *local_140;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_138;
  _func_void_Caliper_ptr_Channel_ptr *local_118;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_110;
  _func_void_Caliper_ptr_Channel_ptr *local_f0;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_e8;
  _func_void_Caliper_ptr_ChannelBody_ptr_Attribute_ptr_Variant_ptr *local_c8;
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  local_c0;
  _func_void_Caliper_ptr_ChannelBody_ptr_Attribute_ptr_Variant_ptr *local_a0;
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  local_98;
  _func_void_Caliper_ptr_ChannelBody_ptr_Attribute_ptr_Variant_ptr *local_78;
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  local_70;
  _func_void_Caliper_ptr_Attribute_ptr *local_40;
  function<void_(cali::Caliper_*,_const_cali::Attribute_&)> local_38;
  Channel *local_18;
  Channel *chn_local;
  Caliper *c_local;
  
  local_18 = chn;
  chn_local = (Channel *)c;
  pEVar1 = cali::Channel::events(chn);
  local_40 = create_attr_cb;
  std::function<void(cali::Caliper*,cali::Attribute_const&)>::
  function<void(*)(cali::Caliper*,cali::Attribute_const&),void>
            ((function<void(cali::Caliper*,cali::Attribute_const&)> *)&local_38,&local_40);
  cali::util::callback<void_(cali::Caliper_*,_const_cali::Attribute_&)>::connect
            (&pEVar1->create_attr_evt,(int)&local_38,__addr,in_ECX);
  std::function<void_(cali::Caliper_*,_const_cali::Attribute_&)>::~function(&local_38);
  pEVar1 = cali::Channel::events(local_18);
  local_78 = begin_cb;
  std::function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
  ::
  function<void(*)(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&),void>
            ((function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
              *)&local_70,&local_78);
  cali::util::
  callback<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::connect(&pEVar1->pre_begin_evt,(int)&local_70,__addr_00,in_ECX);
  std::
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::~function(&local_70);
  pEVar1 = cali::Channel::events(local_18);
  local_a0 = end_cb;
  std::function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
  ::
  function<void(*)(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&),void>
            ((function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
              *)&local_98,&local_a0);
  cali::util::
  callback<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::connect(&pEVar1->pre_end_evt,(int)&local_98,__addr_01,in_ECX);
  std::
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::~function(&local_98);
  pEVar1 = cali::Channel::events(local_18);
  local_c8 = set_cb;
  std::function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
  ::
  function<void(*)(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&),void>
            ((function<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
              *)&local_c0,&local_c8);
  cali::util::
  callback<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::connect(&pEVar1->pre_set_evt,(int)&local_c0,__addr_02,in_ECX);
  std::
  function<void_(cali::Caliper_*,_cali::ChannelBody_*,_const_cali::Attribute_&,_const_cali::Variant_&)>
  ::~function(&local_c0);
  pEVar1 = cali::Channel::events(local_18);
  local_f0 = finish_cb;
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<void(*)(cali::Caliper*,cali::Channel*),void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_e8,&local_f0);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->finish_evt,(int)&local_e8,__addr_03,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_e8);
  pEVar1 = cali::Channel::events(local_18);
  local_118 = create_thread_cb;
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<void(*)(cali::Caliper*,cali::Channel*),void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_110,&local_118);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->create_thread_evt,(int)&local_110,__addr_04,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_110);
  pEVar1 = cali::Channel::events(local_18);
  local_140 = release_thread_cb;
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<void(*)(cali::Caliper*,cali::Channel*),void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_138,&local_140);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->release_thread_evt,(int)&local_138,__addr_05,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_138);
  pEVar1 = cali::Channel::events(local_18);
  local_168 = snapshot_cb;
  std::function<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::
  function<void(*)(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&),void>
            ((function<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)&local_160,
             &local_168);
  cali::util::callback<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>::connect
            (&pEVar1->snapshot,(int)&local_160,__addr_06,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotBuilder_&)>::~function
            (&local_160);
  pEVar1 = cali::Channel::events(local_18);
  local_190 = process_snapshot_cb;
  std::function<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)>::
  function<void(*)(cali::Caliper*,cali::SnapshotView,cali::SnapshotView),void>
            ((function<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)> *)&local_188,
             &local_190);
  cali::util::callback<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::connect
            (&pEVar1->process_snapshot,(int)&local_188,__addr_07,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::~function
            (&local_188);
  cali::Log::Log(&local_398,1);
  poVar2 = cali::Log::stream(&local_398);
  cali::Channel::name_abi_cxx11_(&local_3b8,local_18);
  poVar2 = std::operator<<(poVar2,(string *)&local_3b8);
  poVar2 = std::operator<<(poVar2,": Registered debug service");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_3b8);
  cali::Log::~Log(&local_398);
  return;
}

Assistant:

void debug_service_register(Caliper* c, Channel* chn)
{
    chn->events().create_attr_evt.connect(&create_attr_cb);
    chn->events().pre_begin_evt.connect(&begin_cb);
    chn->events().pre_end_evt.connect(&end_cb);
    chn->events().pre_set_evt.connect(&set_cb);
    chn->events().finish_evt.connect(&finish_cb);
    chn->events().create_thread_evt.connect(&create_thread_cb);
    chn->events().release_thread_evt.connect(&release_thread_cb);
    chn->events().snapshot.connect(&snapshot_cb);
    chn->events().process_snapshot.connect(&process_snapshot_cb);

    Log(1).stream() << chn->name() << ": Registered debug service" << std::endl;
}